

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O1

int run_test_tcp_read_stop_start(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  undefined8 *extraout_RDX;
  int iVar3;
  char *pcVar4;
  uv_tcp_t *puVar5;
  uv_connect_t *puVar6;
  sockaddr_in addr;
  sockaddr_in sStack_18;
  
  puVar2 = uv_default_loop();
  pcVar4 = "0.0.0.0";
  iVar3 = 0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    iVar3 = 0x35fb80;
    puVar5 = (uv_tcp_t *)puVar2;
    iVar1 = uv_tcp_init(puVar2,&server);
    if (iVar1 != 0) goto LAB_0017ec52;
    puVar5 = &server;
    iVar3 = (int)&sStack_18;
    iVar1 = uv_tcp_bind(&server,(sockaddr *)&sStack_18,0);
    if (iVar1 != 0) goto LAB_0017ec57;
    puVar5 = &server;
    iVar3 = 10;
    iVar1 = uv_listen((uv_stream_t *)&server,10,on_connection);
    if (iVar1 != 0) goto LAB_0017ec5c;
    puVar5 = (uv_tcp_t *)0x1b4e3a;
    iVar3 = 0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
    if (iVar1 != 0) goto LAB_0017ec61;
    iVar3 = 0x35fc78;
    puVar5 = (uv_tcp_t *)puVar2;
    iVar1 = uv_tcp_init(puVar2,&client);
    if (iVar1 != 0) goto LAB_0017ec66;
    puVar6 = &connect_req;
    iVar3 = 0x35fc78;
    iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&sStack_18,on_connect);
    puVar5 = (uv_tcp_t *)puVar6;
    if (iVar1 != 0) goto LAB_0017ec6b;
    iVar3 = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017ec70;
    if (read_cb_called < 2) goto LAB_0017ec75;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_read_stop_start_cold_1();
    puVar5 = (uv_tcp_t *)pcVar4;
LAB_0017ec52:
    run_test_tcp_read_stop_start_cold_2();
LAB_0017ec57:
    run_test_tcp_read_stop_start_cold_3();
LAB_0017ec5c:
    run_test_tcp_read_stop_start_cold_4();
LAB_0017ec61:
    run_test_tcp_read_stop_start_cold_5();
LAB_0017ec66:
    run_test_tcp_read_stop_start_cold_6();
LAB_0017ec6b:
    puVar2 = (uv_loop_t *)puVar5;
    run_test_tcp_read_stop_start_cold_7();
LAB_0017ec70:
    run_test_tcp_read_stop_start_cold_8();
LAB_0017ec75:
    run_test_tcp_read_stop_start_cold_9();
  }
  run_test_tcp_read_stop_start_cold_10();
  if (iVar3 == 0) {
    iVar3 = 0x35fdd8;
    iVar1 = uv_tcp_init(*(uv_loop_t **)&puVar2->active_handles,&connection);
    if (iVar1 != 0) goto LAB_0017ecd3;
    iVar3 = 0x35fdd8;
    iVar1 = uv_accept((uv_stream_t *)puVar2,(uv_stream_t *)&connection);
    if (iVar1 == 0) {
      iVar3 = 0x17ecfc;
      iVar1 = uv_read_start((uv_stream_t *)&connection,on_alloc,on_read1);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017ecdd;
    }
  }
  else {
    on_connection_cold_1();
LAB_0017ecd3:
    on_connection_cold_2();
  }
  on_connection_cold_3();
LAB_0017ecdd:
  on_connection_cold_4();
  if (iVar3 == 0) {
    do_write((uv_stream_t *)&client,on_write_close_immediately);
    return extraout_EAX;
  }
  on_connect_cold_1();
  *extraout_RDX = on_alloc::slab;
  extraout_RDX[1] = 0x10000;
  return 0x35fed0;
}

Assistant:

TEST_IMPL(tcp_read_stop_start) {
  uv_loop_t* loop = uv_default_loop();

  { /* Server */
    struct sockaddr_in addr;

    ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

    ASSERT(0 == uv_tcp_init(loop, &server));

    ASSERT(0 == uv_tcp_bind(&server, (struct sockaddr*) & addr, 0));

    ASSERT(0 == uv_listen((uv_stream_t*)&server, 10, on_connection));
  }

  { /* Client */
    struct sockaddr_in addr;

    ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

    ASSERT(0 == uv_tcp_init(loop, &client));

    ASSERT(0 == uv_tcp_connect(&connect_req, &client,
                               (const struct sockaddr*) & addr, on_connect));
  }

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(read_cb_called >= 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}